

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::Deserializer::List::ReadElement<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
          (List *this)

{
  Deserializer *deserializer;
  int iVar1;
  ColumnStatistics *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar2;
  Deserializer *local_28;
  Deserializer *local_20;
  
  deserializer = (Deserializer *)*in_RSI;
  this->deserializer = (Deserializer *)0x0;
  this[1].deserializer = (Deserializer *)0x0;
  iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    ColumnStatistics::Deserialize((ColumnStatistics *)&local_28,deserializer);
    this->deserializer = local_28;
    this[1].deserializer = local_20;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Deserializer::List::ReadElement() {
	return deserializer.Read<T>();
}